

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextstream_p.cpp
# Opt level: O2

void QDeviceClosedNotifier::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  QTextStream::flush((QTextStream *)_o[1]._vptr_QObject);
  return;
}

Assistant:

void QDeviceClosedNotifier::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceClosedNotifier *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->flushStream(); break;
        default: ;
        }
    }
    (void)_a;
}